

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O3

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::remove_srv(raft_server *this,int srv_id)

{
  int32 in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  undefined4 in_register_00000034;
  ptr<cmd_result<ptr<buffer>_>_> pVar2;
  ptr<req_msg> req;
  ptr<log_entry> log;
  ptr<buffer> buf;
  log_val_type local_89;
  _Any_data local_88;
  value_type local_78;
  shared_ptr<nuraft::buffer> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  buffer::alloc((buffer *)&local_68,4);
  buffer::put(local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,in_EDX)
  ;
  buffer::pos(local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  local_58 = (ulong)local_58._4_4_ << 0x20;
  local_89 = cluster_server;
  local_78.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
            (&local_78.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(log_entry **)&local_78,(allocator<nuraft::log_entry> *)&local_88,(int *)&local_58,
             &local_68,&local_89);
  local_88._8_8_ = operator_new(0x60);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_005b13d0;
  local_88._M_unused._0_8_ = (undefined8)(local_88._8_8_ + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x10))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x20))->_vptr__Sp_counted_base
       = (_func_int **)0x8;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR__req_msg_005b1420;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x30))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x30))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x30))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x40))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x40))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x40))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x50))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x50))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x50))->_M_weak_count = 0;
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_88._8_8_ + 0x40))->
                _M_use_count,&local_78);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  pVar2 = send_msg_to_leader(this,(ptr<req_msg> *)CONCAT44(in_register_00000034,srv_id),
                             (req_ext_params *)&local_88);
  _Var1 = pVar2.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
    _Var1._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_78.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  pVar2.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  pVar2.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar2.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::remove_srv(const int srv_id)
{
    ptr<buffer> buf(buffer::alloc(sz_int));
    buf->put(srv_id);
    buf->pos(0);
    ptr<log_entry> log(cs_new<log_entry>(0, buf, log_val_type::cluster_server));
    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::remove_server_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 );
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}